

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int in_EDX;
  void *in_stack_00000040;
  kmp_flag_64 *in_stack_00000048;
  kmp_info_t *in_stack_00000050;
  __pid_t _Var2;
  
  if (in_EDX == 0) {
    bVar1 = __kmp_wait_template<kmp_flag_64,0,false,true>
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040);
    _Var2 = (__pid_t)CONCAT71(extraout_var_00,bVar1);
  }
  else {
    bVar1 = __kmp_wait_template<kmp_flag_64,1,false,true>
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040);
    _Var2 = (__pid_t)CONCAT71(extraout_var,bVar1);
  }
  return _Var2;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    if (final_spin)
      __kmp_wait_template<kmp_flag_64, TRUE>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      __kmp_wait_template<kmp_flag_64, FALSE>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
  }